

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter<spdlog::details::null_scoped_padder>::format
          (c_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  string_view_t view_00;
  reference ppcVar1;
  char *pcVar2;
  const_reference ppcVar3;
  memory_buf_t *dest_00;
  memory_buf_t *in_RCX;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  char *in_stack_ffffffffffffff68;
  array<const_char_*,_7UL> *in_stack_ffffffffffffff70;
  buffer<char> *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  char *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int n;
  int n_00;
  null_scoped_padder local_49;
  size_t local_48;
  value_type local_20;
  buffer<char> *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_48 = 0x18;
  null_scoped_padder::null_scoped_padder(&local_49,0x18,(padding_info *)(in_RDI + 8),in_RCX);
  ppcVar1 = std::array<const_char_*,_7UL>::operator[]
                      (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
  local_20 = *ppcVar1;
  this_00 = (buffer<char> *)&stack0xffffffffffffffa0;
  n_00 = (int)((ulong)local_20 >> 0x20);
  local_18 = this_00;
  pcVar2 = (char *)std::char_traits<char>::length((char_type *)0x1771da);
  this_00->ptr_ = pcVar2;
  view.size_ = in_stack_ffffffffffffff90;
  view.data_ = in_stack_ffffffffffffff88;
  fmt_helper::append_string_view
            (view,(memory_buf_t *)
                  CONCAT17(in_stack_ffffffffffffff87,
                           CONCAT16(in_stack_ffffffffffffff86,
                                    CONCAT15(in_stack_ffffffffffffff85,
                                             CONCAT14(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80)))));
  n = CONCAT13(0x20,(int3)in_stack_ffffffffffffff9c);
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  ppcVar3 = std::array<const_char_*,_12UL>::operator[]
                      ((array<const_char_*,_12UL> *)this_00,(size_type)in_stack_ffffffffffffff68);
  pcVar2 = *ppcVar3;
  local_8 = &stack0xffffffffffffff88;
  local_10 = pcVar2;
  dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x177260);
  view_00.size_ = (size_t)dest_00;
  view_00.data_ = pcVar2;
  fmt_helper::append_string_view
            (view_00,(memory_buf_t *)
                     CONCAT17(in_stack_ffffffffffffff87,
                              CONCAT16(in_stack_ffffffffffffff86,
                                       CONCAT15(in_stack_ffffffffffffff85,
                                                CONCAT14(in_stack_ffffffffffffff84,
                                                         in_stack_ffffffffffffff80)))));
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  fmt_helper::append_int<int>(n_00,(memory_buf_t *)CONCAT44(n,in_stack_ffffffffffffff98));
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  fmt_helper::pad2(n,dest_00);
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  fmt_helper::pad2(n,dest_00);
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  fmt_helper::pad2(n,dest_00);
  ::fmt::v8::detail::buffer<char>::push_back(this_00,in_stack_ffffffffffffff68);
  fmt_helper::append_int<int>(n_00,(memory_buf_t *)CONCAT44(n,in_stack_ffffffffffffff98));
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }